

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-arith-const.cc
# Opt level: O1

void __thiscall
dynet::ConstantMinusX::backward_dev_impl<dynet::Device_CPU>
          (ConstantMinusX *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  type local_48;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_38;
  type local_28;
  
  local_38.m_lhs_xpr = &local_48;
  uVar3 = (ulong)(dEdf->d).nd;
  iVar1 = 1;
  iVar2 = 1;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      iVar2 = iVar2 * (dEdf->d).d[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  local_28.m_rhs_xpr.m_data = dEdf->v;
  local_48.m_data = dEdxi->v;
  uVar3 = (ulong)(dEdxi->d).nd;
  if (uVar3 != 0) {
    iVar1 = 1;
    uVar4 = 0;
    do {
      iVar1 = iVar1 * (dEdxi->d).d[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  local_28.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = (dEdf->d).bd * iVar2;
  local_28.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_48.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar1 * (dEdxi->d).bd;
  local_48.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_38.m_rhs_xpr = &local_28;
  local_28.m_lhs_xpr.m_data = local_48.m_data;
  local_28.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
       local_48.m_dimensions.super_array<long,_1>._M_elems[0];
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run(&local_38,dev->edevice);
  return;
}

Assistant:

void ConstantMinusX::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  dEdxi.tvec().device(*dev.edevice) -= dEdf.tvec();
}